

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmainwindowlayout_p.h
# Opt level: O2

bool __thiscall
QMainWindowLayoutSeparatorHelper<QDockWidgetGroupLayout>::windowEvent
          (QMainWindowLayoutSeparatorHelper<QDockWidgetGroupLayout> *this,QEvent *event)

{
  qsizetype *this_00;
  int **this_01;
  short sVar1;
  long lVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  bool bVar5;
  bool bVar6;
  int iVar7;
  int iVar8;
  undefined4 uVar9;
  QWidget *pQVar10;
  QPaintDevice *pQVar11;
  QPoint *pos;
  QMouseEvent *e;
  long in_FS_OFFSET;
  undefined1 auVar12 [16];
  QPainter p;
  Data *local_48;
  QRegion r;
  
  lVar2 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = &this[-1].movingSeparator.d.size;
  pQVar10 = QLayout::parentWidget((QLayout *)this_00);
  sVar1 = *(short *)(event + 8);
  bVar5 = true;
  switch(sVar1) {
  case 1:
    if (*(TimerId *)(event + 0x10) == (this->separatorMoveTimer).m_id) {
      uVar9 = QBasicTimer::stop();
      if (((this->movingSeparator).d.size != 0) &&
         (iVar7 = -(uint)((this->movingSeparatorPos).xp.m_i == (this->movingSeparatorOrigin).xp.m_i)
         , iVar8 = -(uint)((this->movingSeparatorPos).yp.m_i == (this->movingSeparatorOrigin).yp.m_i
                          ), auVar12._4_4_ = iVar7, auVar12._0_4_ = iVar7, auVar12._8_4_ = iVar8,
         auVar12._12_4_ = iVar8, iVar7 = movmskpd(uVar9,auVar12), iVar7 != 3)) {
        pQVar10 = QLayout::parentWidget((QLayout *)this_00);
        this_01 = &this[1].hoverSeparator.d.ptr;
        QDockAreaLayoutInfo::separatorRegion((QDockAreaLayoutInfo *)&p);
        QWidget::update(pQVar10,(QRegion *)&p);
        QRegion::~QRegion((QRegion *)&p);
        QDockAreaLayoutInfo::operator=
                  ((QDockAreaLayoutInfo *)this_01,
                   (QDockAreaLayoutInfo *)&this[2].hoverSeparator.d.size);
        QDockAreaLayoutInfo::separatorMove
                  ((QDockAreaLayoutInfo *)this_01,&this->movingSeparator,
                   &this->movingSeparatorOrigin,&this->movingSeparatorPos);
        this->movingSeparatorPos = this->movingSeparatorOrigin;
      }
      goto LAB_00406c50;
    }
    break;
  case 2:
    if (*(int *)(event + 0x40) == 1) {
      _p = QSinglePointEvent::position((QSinglePointEvent *)event);
      r.d = (QRegionData *)QPointF::toPoint((QPointF *)&p);
      bVar6 = startSeparatorMove(this,(QPoint *)&r);
      goto LAB_00406bfa;
    }
    break;
  case 3:
    _p = QSinglePointEvent::position((QSinglePointEvent *)event);
    r.d = (QRegionData *)QPointF::toPoint((QPointF *)&p);
    bVar6 = endSeparatorMove(this,(QPoint *)&r);
LAB_00406bfa:
    if (bVar6 != false) {
      event[0xc] = (QEvent)0x1;
      goto LAB_00406c50;
    }
    break;
  case 4:
  case 6:
  case 7:
  case 8:
  case 9:
  case 10:
  case 0xb:
    break;
  case 5:
    _p = QSinglePointEvent::position((QSinglePointEvent *)event);
    r.d = (QRegionData *)QPointF::toPoint((QPointF *)&p);
    adjustCursor(this,(QPoint *)&r);
    if (((byte)event[0x44] & 1) != 0) {
      _p = QSinglePointEvent::position((QSinglePointEvent *)event);
      r.d = (QRegionData *)QPointF::toPoint((QPointF *)&p);
      bVar6 = separatorMove(this,(QPoint *)&r);
      goto LAB_00406bfa;
    }
    break;
  case 0xc:
    _p = (qreal)&DAT_aaaaaaaaaaaaaaaa;
    pQVar11 = &pQVar10->super_QPaintDevice;
    if (pQVar10 == (QWidget *)0x0) {
      pQVar11 = (QPaintDevice *)0x0;
    }
    QPainter::QPainter(&p,pQVar11);
    r.d = (QRegionData *)&DAT_aaaaaaaaaaaaaaaa;
    QRegion::QRegion(&r,(QRegion *)(event + 0x20));
    QDockAreaLayoutInfo::paintSeparators
              ((QDockAreaLayoutInfo *)&this[1].hoverSeparator.d.ptr,&p,pQVar10,&r,&this->hoverPos);
    QRegion::~QRegion(&r);
    QPainter::~QPainter(&p);
    break;
  default:
    if (sVar1 == 0x33) {
      pos = (QPoint *)&p;
      auVar4._8_8_ = 0;
      auVar4._0_8_ = local_48;
      _p = (QPointF)(auVar4 << 0x40);
    }
    else {
      if (sVar1 == 0x7f) goto LAB_00406c50;
      if (sVar1 == 0x80) {
        auVar3._8_8_ = 0;
        auVar3._0_8_ = local_48;
        _p = (QPointF)(auVar3 << 0x40);
        adjustCursor(this,(QPoint *)&p);
        goto LAB_00406c50;
      }
      if (sVar1 != 0x81) {
        if ((sVar1 == 0xb7) && (this->cursorAdjusted == true)) {
          iVar7 = QCursor::shape();
          QWidget::cursor((QWidget *)&p);
          iVar8 = QCursor::shape();
          QCursor::~QCursor((QCursor *)&p);
          if (iVar7 != iVar8) {
            QWidget::cursor((QWidget *)&p);
            QCursor::operator=(&this->oldCursor,(QCursor *)&p);
            QCursor::~QCursor((QCursor *)&p);
            bVar5 = QWidget::testAttribute_helper(pQVar10,WA_SetCursor);
            this->hasOldCursor = bVar5;
            QWidget::setCursor(pQVar10,&this->adjustedCursor);
          }
        }
        break;
      }
      _p = QSinglePointEvent::position((QSinglePointEvent *)event);
      r.d = (QRegionData *)QPointF::toPoint((QPointF *)&p);
      pos = (QPoint *)&r;
    }
    adjustCursor(this,pos);
  }
  bVar5 = false;
LAB_00406c50:
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar2) {
    __stack_chk_fail();
  }
  return bVar5;
}

Assistant:

bool QMainWindowLayoutSeparatorHelper<Layout>::windowEvent(QEvent *event)
{
    QWidget *w = window();
    switch (event->type()) {
    case QEvent::Paint: {
        QPainter p(w);
        QRegion r = static_cast<QPaintEvent *>(event)->region();
        layout()->dockAreaLayoutInfo()->paintSeparators(&p, w, r, hoverPos);
        break;
    }

#if QT_CONFIG(cursor)
    case QEvent::HoverMove: {
        adjustCursor(static_cast<QHoverEvent *>(event)->position().toPoint());
        break;
    }

    // We don't want QWidget to call update() on the entire QMainWindow
    // on HoverEnter and HoverLeave, hence accept the event (return true).
    case QEvent::HoverEnter:
        return true;
    case QEvent::HoverLeave:
        adjustCursor(QPoint(0, 0));
        return true;
    case QEvent::ShortcutOverride: // when a menu pops up
        adjustCursor(QPoint(0, 0));
        break;
#endif // QT_CONFIG(cursor)

    case QEvent::MouseButtonPress: {
        QMouseEvent *e = static_cast<QMouseEvent *>(event);
        if (e->button() == Qt::LeftButton && startSeparatorMove(e->position().toPoint())) {
            // The click was on a separator, eat this event
            e->accept();
            return true;
        }
        break;
    }

    case QEvent::MouseMove: {
        QMouseEvent *e = static_cast<QMouseEvent *>(event);

#if QT_CONFIG(cursor)
        adjustCursor(e->position().toPoint());
#endif
        if (e->buttons() & Qt::LeftButton) {
            if (separatorMove(e->position().toPoint())) {
                // We're moving a separator, eat this event
                e->accept();
                return true;
            }
        }

        break;
    }

    case QEvent::MouseButtonRelease: {
        QMouseEvent *e = static_cast<QMouseEvent *>(event);
        if (endSeparatorMove(e->position().toPoint())) {
            // We've released a separator, eat this event
            e->accept();
            return true;
        }
        break;
    }

#if QT_CONFIG(cursor)
    case QEvent::CursorChange:
        // CursorChange events are triggered as mouse moves to new widgets even
        // if the cursor doesn't actually change, so do not change oldCursor if
        // the "changed" cursor has same shape as adjusted cursor.
        if (cursorAdjusted && adjustedCursor.shape() != w->cursor().shape()) {
            oldCursor = w->cursor();
            hasOldCursor = w->testAttribute(Qt::WA_SetCursor);

            // Ensure our adjusted cursor stays visible
            w->setCursor(adjustedCursor);
        }
        break;
#endif // QT_CONFIG(cursor)
    case QEvent::Timer:
        if (static_cast<QTimerEvent *>(event)->timerId() == separatorMoveTimer.timerId()) {
            // let's move the separators
            separatorMoveTimer.stop();
            if (movingSeparator.isEmpty())
                return true;
            if (movingSeparatorOrigin == movingSeparatorPos)
                return true;

            // when moving the separator, we need to update the previous position
            window()->update(layout()->dockAreaLayoutInfo()->separatorRegion());

            layout()->layoutState = layout()->savedState;
            layout()->dockAreaLayoutInfo()->separatorMove(movingSeparator, movingSeparatorOrigin,
                                                          movingSeparatorPos);
            movingSeparatorPos = movingSeparatorOrigin;
            return true;
        }
        break;
    default:
        break;
    }
    return false;
}